

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

void Gia_ManMarkWithTravId_rec(Gia_Man_t *p,int Id)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  
  if (Id < p->nTravIdsAlloc) {
    do {
      if (p->pTravIds[Id] == p->nTravIds) {
        return;
      }
      p->pTravIds[Id] = p->nTravIds;
      if ((Id < 0) || (p->nObjs <= Id)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      uVar2 = *(ulong *)(pGVar1 + Id);
      uVar3 = (uint)(uVar2 & 0x1fffffff);
      if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar2) {
        Gia_ManMarkWithTravId_rec(p,Id - ((uint)uVar2 & 0x1fffffff));
        uVar2 = *(ulong *)(pGVar1 + Id);
        uVar3 = (uint)uVar2 & 0x1fffffff;
      }
      if ((int)uVar2 < 0) {
        return;
      }
      if (uVar3 == 0x1fffffff) {
        return;
      }
      Id = Id - ((uint)(uVar2 >> 0x20) & 0x1fffffff);
    } while (Id < p->nTravIdsAlloc);
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x23f,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManMarkWithTravId_rec( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManMarkWithTravId_rec( p, Gia_ObjFaninId0(pObj, Id) );
    if ( Gia_ObjIsAnd(pObj) )
        Gia_ManMarkWithTravId_rec( p, Gia_ObjFaninId1(pObj, Id) );
}